

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  char **ppcVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  
  ppcVar4 = (char **)(end + -(long)ptr);
  if ((long)ppcVar4 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  iVar8 = 0;
  uVar6 = bVar1 - 5;
  if (uVar6 < 0x14) {
    pcVar7 = (char *)((long)&switchD_0045ccdb::switchdataD_005d3e30 +
                     (long)(int)(&switchD_0045ccdb::switchdataD_005d3e30)[uVar6]);
    iVar9 = 0;
    switch((uint)bVar1) {
    case 5:
      iVar9 = -2;
      if (ppcVar4 != (char **)0x1) {
        iVar2 = (*enc[3].literalScanners[0])(enc,ptr,pcVar7,ppcVar4);
        while( true ) {
          lVar5 = 2;
          while( true ) {
            iVar9 = iVar8;
            if (iVar2 == 0) goto switchD_0045ccdb_caseD_8;
LAB_0045cd5b:
            while( true ) {
              ptr = (char *)((byte *)ptr + lVar5);
              uVar3 = (long)end - (long)ptr;
              if ((long)uVar3 < 1) {
                return -1;
              }
              ppcVar4 = (char **)(ulong)(byte)*ptr;
              bVar1 = *(byte *)((long)enc[1].scanners + (long)ppcVar4);
              pcVar7 = (char *)(ulong)bVar1;
              if (bVar1 < 0x12) break;
              lVar5 = 1;
              if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                iVar9 = iVar8;
                if (bVar1 == 0x12) {
                  ptr = (char *)((byte *)ptr + 1);
                  iVar9 = 0x1c;
                }
                goto switchD_0045ccdb_caseD_8;
              }
            }
            if (bVar1 == 5) break;
            if (bVar1 == 6) {
              if (uVar3 < 3) goto LAB_0045ce17;
              iVar2 = (*enc[3].scanners[1])(enc,ptr,pcVar7,ppcVar4);
LAB_0045cde1:
              lVar5 = 3;
            }
            else {
              iVar9 = iVar8;
              if (bVar1 != 7) goto switchD_0045ccdb_caseD_8;
              if (uVar3 < 4) goto LAB_0045ce17;
              iVar2 = (*enc[3].scanners[2])(enc,ptr,pcVar7,ppcVar4);
LAB_0045cdbf:
              lVar5 = 4;
            }
          }
          if (uVar3 == 1) break;
          iVar2 = (*enc[3].scanners[0])(enc,ptr,pcVar7,ppcVar4);
        }
LAB_0045ce17:
        iVar9 = -2;
      }
      break;
    case 6:
      iVar9 = -2;
      if ((char **)0x2 < ppcVar4) {
        iVar2 = (*enc[3].literalScanners[1])(enc,ptr,pcVar7,ppcVar4);
        goto LAB_0045cde1;
      }
      break;
    case 7:
      iVar9 = -2;
      if ((char **)0x3 < ppcVar4) {
        iVar2 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar7,(char *)ppcVar4);
        goto LAB_0045cdbf;
      }
      break;
    default:
      goto switchD_0045ccdb_caseD_8;
    case 9:
    case 10:
    case 0x15:
      goto switchD_0045ccdb_caseD_9;
    case 0x16:
    case 0x18:
      lVar5 = 1;
      goto LAB_0045cd5b;
    }
  }
  else {
    iVar9 = iVar8;
    if (bVar1 == 0x1e) {
switchD_0045ccdb_caseD_9:
      iVar9 = 0x16;
    }
switchD_0045ccdb_caseD_8:
    *nextTokPtr = ptr;
  }
  return iVar9;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}